

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan,true,false>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  long lVar3;
  sel_t *psVar4;
  long lVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  int64_t *piVar10;
  sel_t sVar11;
  ulong uVar12;
  ulong uVar13;
  unsigned_long uVar14;
  ulong uVar15;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar7 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan,true,false,false,true>
                        (ldata,rdata,sel,count,mask,(SelectionVector *)0x0,false_sel);
      return iVar7;
    }
    if (count + 0x3f < 0x40) {
      iVar7 = 0;
    }
    else {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar7 = 0;
      uVar12 = 0;
      uVar8 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar14 = 0xffffffffffffffff;
        }
        else {
          uVar14 = puVar1[uVar12];
        }
        uVar15 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar15 = count;
        }
        uVar9 = uVar15;
        if (uVar14 != 0) {
          uVar9 = uVar8;
          if (uVar14 == 0xffffffffffffffff) {
            if (uVar8 < uVar15) {
              psVar2 = sel->sel_vector;
              uVar13 = ldata->lower;
              lVar3 = ldata->upper;
              psVar4 = true_sel->sel_vector;
              piVar10 = &rdata[uVar8].upper;
              do {
                uVar8 = uVar9;
                if (psVar2 != (sel_t *)0x0) {
                  uVar8 = (ulong)psVar2[uVar9];
                }
                lVar5 = *piVar10;
                uVar6 = ((hugeint_t *)(piVar10 + -1))->lower;
                psVar4[iVar7] = (sel_t)uVar8;
                iVar7 = iVar7 + (uVar6 < uVar13 && lVar3 == lVar5 ||
                                lVar3 != lVar5 && lVar5 <= lVar3);
                uVar9 = uVar9 + 1;
                piVar10 = piVar10 + 2;
              } while (uVar15 != uVar9);
            }
          }
          else if (uVar8 < uVar15) {
            psVar2 = sel->sel_vector;
            psVar4 = true_sel->sel_vector;
            piVar10 = &rdata[uVar8].upper;
            uVar9 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar11 = (int)uVar8 + (int)uVar9;
              }
              else {
                sVar11 = psVar2[uVar8 + uVar9];
              }
              if ((uVar14 >> (uVar9 & 0x3f) & 1) == 0) {
                uVar13 = 0;
              }
              else {
                lVar3 = ldata->upper;
                lVar5 = *piVar10;
                uVar13 = (ulong)(((hugeint_t *)(piVar10 + -1))->lower < ldata->lower &&
                                 lVar3 == lVar5 || lVar3 != lVar5 && lVar5 <= lVar3);
              }
              psVar4[iVar7] = sVar11;
              iVar7 = iVar7 + uVar13;
              uVar9 = uVar9 + 1;
              piVar10 = piVar10 + 2;
            } while ((uVar8 - uVar15) + uVar9 != 0);
            uVar9 = uVar8 + uVar9;
          }
        }
        uVar12 = uVar12 + 1;
        uVar8 = uVar9;
      } while (uVar12 != count + 0x3f >> 6);
    }
  }
  else {
    iVar7 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan,true,false,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  return iVar7;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}